

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

quath tinyusdz::slerp(quath *_a,quath *_b,float t)

{
  half hVar1;
  half hVar2;
  half hVar3;
  half hVar4;
  quatf qVar5;
  quatf b;
  quatf a;
  float local_68;
  float fStack_64;
  float fStack_54;
  quatf local_40;
  quatf local_30;
  
  local_30.imag._M_elems[0] = value::half_to_float((half)(_a->imag)._M_elems[0].value);
  local_30.imag._M_elems[1] = value::half_to_float((half)(_a->imag)._M_elems[1].value);
  local_30.imag._M_elems[2] = value::half_to_float((half)(_a->imag)._M_elems[2].value);
  local_30.real = value::half_to_float((half)(_a->real).value);
  local_40.imag._M_elems[0] = value::half_to_float((half)(_b->imag)._M_elems[0].value);
  local_40.imag._M_elems[1] = value::half_to_float((half)(_b->imag)._M_elems[1].value);
  local_40.imag._M_elems[2] = value::half_to_float((half)(_b->imag)._M_elems[2].value);
  local_40.real = value::half_to_float((half)(_b->real).value);
  qVar5 = slerp(&local_30,&local_40,t);
  hVar1 = value::float_to_half_full(qVar5.imag._M_elems[0]);
  fStack_54 = qVar5.imag._M_elems[1];
  hVar2 = value::float_to_half_full(fStack_54);
  local_68 = qVar5.imag._M_elems[2];
  hVar3 = value::float_to_half_full(local_68);
  fStack_64 = qVar5.real;
  hVar4 = value::float_to_half_full(fStack_64);
  return (quath)((ulong)hVar1.value |
                (ulong)hVar2.value << 0x10 | (ulong)hVar3.value << 0x20 | (ulong)hVar4.value << 0x30
                );
}

Assistant:

value::quath slerp(const value::quath &_a, const value::quath &_b, const float t) {
  value::quatf a;
  value::quatf b;

  a[0] = value::half_to_float(_a[0]);
  a[1] = value::half_to_float(_a[1]);
  a[2] = value::half_to_float(_a[2]);
  a[3] = value::half_to_float(_a[3]);

  b[0] = value::half_to_float(_b[0]);
  b[1] = value::half_to_float(_b[1]);
  b[2] = value::half_to_float(_b[2]);
  b[3] = value::half_to_float(_b[3]);

  value::quatf _c = slerp(a, b, t);

  value::quath c;
  c[0] = value::float_to_half_full(_c[0]);
  c[1] = value::float_to_half_full(_c[1]);
  c[2] = value::float_to_half_full(_c[2]);
  c[3] = value::float_to_half_full(_c[3]);

  return c;
}